

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

DefinitionLookupResult * __thiscall
slang::ast::Compilation::tryGetDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view lookupName,
          Scope *scope)

{
  group_type_pointer pgVar1;
  RootSymbol *pRVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  value_type_pointer ppVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  SourceLibrary *pSVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  byte bVar15;
  uint uVar16;
  InstanceBodySymbol *pIVar17;
  SourceLibrary *pSVar18;
  Symbol *pSVar19;
  Symbol *pSVar20;
  pointer ppSVar21;
  value_type_pointer __u;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  value_type_pointer ppVar26;
  pointer ppSVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  byte bVar45;
  ResolvedConfig *local_100;
  size_t seed;
  pointer ppSStack_d0;
  pointer local_c8;
  ulong local_b8;
  Symbol *local_b0;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> local_a8;
  undefined8 local_88;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  undefined8 local_78;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  ppSStack_d0 = (pointer)seed;
  local_b0 = (Symbol *)scope;
  pIVar17 = Scope::getContainingInstance(scope);
  if ((pIVar17 == (InstanceBodySymbol *)0x0) || (pIVar17->parentInstance == (InstanceSymbol *)0x0))
  {
    local_100 = (ResolvedConfig *)0x0;
  }
  else {
    local_100 = pIVar17->parentInstance->resolvedConfig;
  }
  pRVar2 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_a8.first.definition = (Symbol *)&pRVar2->super_Scope;
  if (pRVar2 == (RootSymbol *)0x0) {
    local_a8.first.definition = (Symbol *)0x0;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = ppSStack_d0;
  _seed = auVar13 << 0x40;
  local_a8.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
  local_a8.first.configRule = (ConfigRule *)lookupName._M_str;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)&local_a8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = seed;
  uVar25 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,0);
  uVar23 = uVar25 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar24 = (uVar25 & 0xff) * 4;
  uVar30 = (&UNK_0047072c)[lVar24];
  uVar31 = (&UNK_0047072d)[lVar24];
  uVar32 = (&UNK_0047072e)[lVar24];
  bVar33 = (&UNK_0047072f)[lVar24];
  uVar22 = 0;
  uVar34 = uVar30;
  uVar35 = uVar31;
  uVar36 = uVar32;
  bVar37 = bVar33;
  uVar38 = uVar30;
  uVar39 = uVar31;
  uVar40 = uVar32;
  bVar41 = bVar33;
  uVar42 = uVar30;
  uVar43 = uVar31;
  uVar44 = uVar32;
  bVar45 = bVar33;
  do {
    pgVar3 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar23;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    auVar28[0] = -(local_48 == uVar30);
    auVar28[1] = -(uStack_47 == uVar31);
    auVar28[2] = -(uStack_46 == uVar32);
    auVar28[3] = -(bStack_45 == bVar33);
    auVar28[4] = -(uStack_44 == uVar34);
    auVar28[5] = -(uStack_43 == uVar35);
    auVar28[6] = -(uStack_42 == uVar36);
    auVar28[7] = -(bStack_41 == bVar37);
    auVar28[8] = -(uStack_40 == uVar38);
    auVar28[9] = -(uStack_3f == uVar39);
    auVar28[10] = -(uStack_3e == uVar40);
    auVar28[0xb] = -(bStack_3d == bVar41);
    auVar28[0xc] = -(uStack_3c == uVar42);
    auVar28[0xd] = -(uStack_3b == uVar43);
    auVar28[0xe] = -(uStack_3a == uVar44);
    auVar28[0xf] = -(bStack_39 == bVar45);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
    bVar15 = bStack_39;
    if (uVar16 != 0) {
      local_78 = (Symbol *)
                 CONCAT17(bVar37,CONCAT16(uVar36,CONCAT15(uVar35,CONCAT14(uVar34,CONCAT13(bVar33,
                                                  CONCAT12(uVar32,CONCAT11(uVar31,uVar30)))))));
      ppVar26 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.elements_;
      local_b8 = uVar23;
      local_88 = uVar22;
      uStack_70 = uVar38;
      uStack_6f = uVar39;
      uStack_6e = uVar40;
      bStack_6d = bVar41;
      uStack_6c = uVar42;
      uStack_6b = uVar43;
      uStack_6a = uVar44;
      bStack_69 = bVar45;
      do {
        uVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        __u = ppVar26 + uVar23 * 0xf + (ulong)uVar9;
        bVar14 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_a8,&__u->first);
        if (bVar14) {
          pSVar20 = local_b0;
          ppVar26 = __u;
          if ((__u->second).second != true) goto LAB_00296c04;
          goto LAB_00296a64;
        }
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
      pgVar3 = pgVar3 + uVar23;
      uVar22 = local_88;
      uVar23 = local_b8;
      uVar30 = (uchar)local_78;
      uVar31 = local_78._1_1_;
      uVar32 = local_78._2_1_;
      bVar33 = local_78._3_1_;
      uVar34 = local_78._4_1_;
      uVar35 = local_78._5_1_;
      uVar36 = local_78._6_1_;
      bVar37 = local_78._7_1_;
      uVar38 = uStack_70;
      uVar39 = uStack_6f;
      uVar40 = uStack_6e;
      bVar41 = bStack_6d;
      uVar42 = uStack_6c;
      uVar43 = uStack_6b;
      uVar44 = uStack_6a;
      bVar45 = bStack_69;
      bVar15 = pgVar3->m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7] & bVar15) == 0) break;
    uVar4 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar24 = uVar23 + uVar22;
    uVar22 = uVar22 + 1;
    uVar23 = lVar24 + 1U & uVar4;
  } while (uVar22 <= uVar4);
  if (local_100 != (ResolvedConfig *)0x0) {
    local_c8 = (pointer)0x0;
    _seed = (undefined1  [16])0x0;
    resolveConfigRules(&local_a8,this,lookupName,(Scope *)local_b0,local_100,(ConfigRule *)0x0,
                       (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&seed)
    ;
    __return_storage_ptr__->configRule = local_a8.first.configRule;
    __return_storage_ptr__->definition = local_a8.first.definition;
    __return_storage_ptr__->configRoot = local_a8.first.configRoot;
    if (seed == 0) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)seed,(long)local_c8 - seed);
    return __return_storage_ptr__;
  }
  goto LAB_00296ca2;
  while( true ) {
    pRVar2 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    pSVar19 = (Symbol *)&pRVar2->super_Scope;
    if (pRVar2 == (RootSymbol *)0x0) {
      pSVar19 = (Symbol *)0x0;
    }
    if (pSVar20 == pSVar19) break;
LAB_00296a64:
    auVar12._8_8_ = 0;
    auVar12._0_8_ = ppSStack_d0;
    _seed = auVar12 << 0x40;
    local_a8.first.definition = pSVar20;
    local_a8.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
    local_a8.first.configRule = (ConfigRule *)lookupName._M_str;
    local_78 = pSVar20;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                   *)&local_a8);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = seed;
    uVar25 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
             SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
    uVar23 = uVar25 >> ((byte)(this->definitionMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar24 = (uVar25 & 0xff) * 4;
    uVar30 = (&UNK_0047072c)[lVar24];
    uVar31 = (&UNK_0047072d)[lVar24];
    uVar32 = (&UNK_0047072e)[lVar24];
    bVar33 = (&UNK_0047072f)[lVar24];
    uVar22 = 0;
    uVar34 = uVar30;
    uVar35 = uVar31;
    uVar36 = uVar32;
    bVar37 = bVar33;
    uVar38 = uVar30;
    uVar39 = uVar31;
    uVar40 = uVar32;
    bVar41 = bVar33;
    uVar42 = uVar30;
    uVar43 = uVar31;
    uVar44 = uVar32;
    bVar45 = bVar33;
    do {
      pgVar3 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar1 = pgVar3 + uVar23;
      local_58 = pgVar1->m[0].n;
      uStack_57 = pgVar1->m[1].n;
      uStack_56 = pgVar1->m[2].n;
      bStack_55 = pgVar1->m[3].n;
      uStack_54 = pgVar1->m[4].n;
      uStack_53 = pgVar1->m[5].n;
      uStack_52 = pgVar1->m[6].n;
      bStack_51 = pgVar1->m[7].n;
      uStack_50 = pgVar1->m[8].n;
      uStack_4f = pgVar1->m[9].n;
      uStack_4e = pgVar1->m[10].n;
      bStack_4d = pgVar1->m[0xb].n;
      uStack_4c = pgVar1->m[0xc].n;
      uStack_4b = pgVar1->m[0xd].n;
      uStack_4a = pgVar1->m[0xe].n;
      bVar15 = pgVar1->m[0xf].n;
      auVar29[0] = -(local_58 == uVar30);
      auVar29[1] = -(uStack_57 == uVar31);
      auVar29[2] = -(uStack_56 == uVar32);
      auVar29[3] = -(bStack_55 == bVar33);
      auVar29[4] = -(uStack_54 == uVar34);
      auVar29[5] = -(uStack_53 == uVar35);
      auVar29[6] = -(uStack_52 == uVar36);
      auVar29[7] = -(bStack_51 == bVar37);
      auVar29[8] = -(uStack_50 == uVar38);
      auVar29[9] = -(uStack_4f == uVar39);
      auVar29[10] = -(uStack_4e == uVar40);
      auVar29[0xb] = -(bStack_4d == bVar41);
      auVar29[0xc] = -(uStack_4c == uVar42);
      auVar29[0xd] = -(uStack_4b == uVar43);
      auVar29[0xe] = -(uStack_4a == uVar44);
      auVar29[0xf] = -(bVar15 == bVar45);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar15;
      if (uVar16 != 0) {
        local_88 = CONCAT17(bVar37,CONCAT16(uVar36,CONCAT15(uVar35,CONCAT14(uVar34,CONCAT13(bVar33,
                                                  CONCAT12(uVar32,CONCAT11(uVar31,uVar30)))))));
        ppVar5 = (this->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.elements_;
        local_b8 = uVar22;
        uStack_80 = uVar38;
        uStack_7f = uVar39;
        uStack_7e = uVar40;
        bStack_7d = bVar41;
        uStack_7c = uVar42;
        uStack_7b = uVar43;
        uStack_7a = uVar44;
        bStack_79 = bVar45;
        local_60 = uVar23;
        do {
          uVar9 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          ppVar26 = ppVar5 + uVar23 * 0xf + (ulong)uVar9;
          bVar14 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)&local_a8,&ppVar26->first);
          if (bVar14) goto LAB_00296c04;
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        bVar15 = pgVar3[uVar23].m[0xf].n;
        uVar22 = local_b8;
        uVar23 = local_60;
        uVar30 = (uchar)local_88;
        uVar31 = local_88._1_1_;
        uVar32 = local_88._2_1_;
        bVar33 = local_88._3_1_;
        uVar34 = local_88._4_1_;
        uVar35 = local_88._5_1_;
        uVar36 = local_88._6_1_;
        bVar37 = local_88._7_1_;
        uVar38 = uStack_80;
        uVar39 = uStack_7f;
        uVar40 = uStack_7e;
        bVar41 = bStack_7d;
        uVar42 = uStack_7c;
        uVar43 = uStack_7b;
        uVar44 = uStack_7a;
        bVar45 = bStack_79;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7] & bVar15) == 0) break;
      uVar4 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
      lVar24 = uVar23 + uVar22;
      uVar22 = uVar22 + 1;
      uVar23 = lVar24 + 1U & uVar4;
    } while (uVar22 <= uVar4);
    pSVar20 = (Symbol *)((Symbol *)(local_78->name)._M_len)->parentScope;
    ppVar26 = __u;
    if (pSVar20 == (Symbol *)0x0) break;
  }
LAB_00296c04:
  if (local_100 != (ResolvedConfig *)0x0) {
    resolveConfigRules(&local_a8,this,lookupName,(Scope *)local_b0,local_100,(ConfigRule *)0x0,
                       &(ppVar26->second).first);
    __return_storage_ptr__->configRule = local_a8.first.configRule;
    __return_storage_ptr__->definition = local_a8.first.definition;
    __return_storage_ptr__->configRoot = local_a8.first.configRoot;
    return __return_storage_ptr__;
  }
  ppSVar6 = (this->defaultLiblist).
            super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar21 = (this->defaultLiblist).
                  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar21 != ppSVar6;
      ppSVar21 = ppSVar21 + 1) {
    ppSVar27 = (ppVar26->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (ppVar26->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar27 != ppSVar7) {
      pSVar8 = *ppSVar21;
      do {
        pSVar20 = *ppSVar27;
        pSVar18 = Symbol::getSourceLibrary(pSVar20);
        if (pSVar18 == pSVar8) {
          __return_storage_ptr__->definition = pSVar20;
          goto LAB_00296c87;
        }
        ppSVar27 = ppSVar27 + 1;
      } while (ppSVar27 != ppSVar7);
    }
  }
  ppSVar27 = (ppVar26->second).first.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppSVar27 !=
      (ppVar26->second).first.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __return_storage_ptr__->definition = *ppSVar27;
LAB_00296c87:
    __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
    __return_storage_ptr__->configRule = (ConfigRule *)0x0;
    return __return_storage_ptr__;
  }
LAB_00296ca2:
  __return_storage_ptr__->definition = (Symbol *)0x0;
  __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
  __return_storage_ptr__->configRule = (ConfigRule *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::tryGetDefinition(std::string_view lookupName,
                                                                  const Scope& scope) const {
    // Try to find a config block for this scope to help choose the right definition.
    const ResolvedConfig* resolvedConfig = nullptr;
    if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
        resolvedConfig = inst->parentInstance->resolvedConfig;

    // Always search in the root scope to start. Most definitions are global.
    auto it = definitionMap.find({lookupName, root.get()});
    if (it == definitionMap.end()) {
        // If there's a config it might be able to provide an
        // override for this cell name.
        if (resolvedConfig)
            return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, {}).first;
        return {};
    }

    // If the second flag is set it means there are nested modules
    // with this name, so we need to do full scope resolution.
    if (it->second.second) {
        auto searchScope = &scope;
        do {
            auto scopeIt = definitionMap.find({lookupName, searchScope});
            if (scopeIt != definitionMap.end()) {
                it = scopeIt;
                break;
            }

            searchScope = searchScope->asSymbol().getParentScope();
        } while (searchScope && searchScope != root.get());
    }

    auto& defList = it->second.first;
    if (resolvedConfig)
        return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, defList).first;

    // If there is a global priority list try to use that.
    for (auto lib : defaultLiblist) {
        for (auto def : defList) {
            if (def->getSourceLibrary() == lib)
                return def;
        }
    }

    // Otherwise return the first definition in the list -- it's already
    // sorted in priority order.
    return defList.empty() ? DefinitionLookupResult{} : DefinitionLookupResult{defList.front()};
}